

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O2

void FastPForLib::Simple9<true,_false>::unpack5_5(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x17 & 0x1f;
  puVar2[1] = *puVar1 >> 0x12 & 0x1f;
  puVar2[2] = *puVar1 >> 0xd & 0x1f;
  puVar2[3] = *puVar1 >> 8 & 0x1f;
  puVar2[4] = *puVar1 >> 3 & 0x1f;
  *in = puVar1 + 1;
  *out = puVar2 + 5;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack5_5(uint32_t **out,
                                            const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 23) & 0x1f;
  pout[1] = (pin[0] >> 18) & 0x1f;
  pout[2] = (pin[0] >> 13) & 0x1f;
  pout[3] = (pin[0] >> 8) & 0x1f;
  pout[4] = (pin[0] >> 3) & 0x1f;

  *in = pin + 1;
  *out = pout + 5;
}